

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::block_is_noop(Compiler *this,SPIRBlock *block)

{
  BlockID *pBVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRBlock *pSVar6;
  uint32_t *puVar7;
  SPIRExtension *pSVar8;
  Phi *pPVar9;
  long lVar10;
  Instruction *i;
  Instruction *instr;
  bool bVar11;
  
  if (*(int *)&(block->super_IVariant).field_0xc == 1) {
    pSVar6 = get<spirv_cross::SPIRBlock>(this,(block->next_block).id);
    pPVar9 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
    uVar3 = (block->super_IVariant).self.id;
    lVar10 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size * 0xc;
    while (lVar10 != 0) {
      uVar4 = (pPVar9->parent).id;
      if (uVar4 == uVar3) {
        return false;
      }
      pPVar9 = pPVar9 + 1;
      lVar10 = lVar10 + -0xc;
      if (uVar4 == (pSVar6->super_IVariant).self.id) {
        return false;
      }
    }
    lVar10 = (pSVar6->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size * 0xc
    ;
    pPVar9 = (pSVar6->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
    do {
      if (lVar10 == 0) {
        instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
        lVar10 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc;
        do {
          bVar11 = lVar10 == 0;
          if (bVar11) {
            return bVar11;
          }
          uVar2 = instr->op;
          if ((uVar2 != 8) && (uVar2 != 0x13d)) {
            if (uVar2 != 0xc) {
              return bVar11;
            }
            puVar7 = stream(this,instr);
            pSVar8 = get<spirv_cross::SPIRExtension>(this,puVar7[2]);
            uVar5 = *(uint *)&(pSVar8->super_IVariant).field_0xc;
            if (9 < uVar5) {
              return bVar11;
            }
            if ((0x304U >> (uVar5 & 0x1f) & 1) == 0) {
              return bVar11;
            }
          }
          instr = instr + 1;
          lVar10 = lVar10 + -0xc;
        } while( true );
      }
      lVar10 = lVar10 + -0xc;
      pBVar1 = &pPVar9->parent;
      pPVar9 = pPVar9 + 1;
    } while (pBVar1->id != uVar3);
  }
  return false;
}

Assistant:

bool Compiler::block_is_noop(const SPIRBlock &block) const
{
	if (block.terminator != SPIRBlock::Direct)
		return false;

	auto &child = get<SPIRBlock>(block.next_block);

	// If this block participates in PHI, the block isn't really noop.
	for (auto &phi : block.phi_variables)
		if (phi.parent == block.self || phi.parent == child.self)
			return false;

	for (auto &phi : child.phi_variables)
		if (phi.parent == block.self)
			return false;

	// Verify all instructions have no semantic impact.
	for (auto &i : block.ops)
	{
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		// Non-Semantic instructions.
		case OpLine:
		case OpNoLine:
			break;

		case OpExtInst:
		{
			auto *ops = stream(i);
			auto ext = get<SPIRExtension>(ops[2]).ext;

			bool ext_is_nonsemantic_only =
				ext == SPIRExtension::NonSemanticShaderDebugInfo ||
				ext == SPIRExtension::SPV_debug_info ||
				ext == SPIRExtension::NonSemanticGeneric;

			if (!ext_is_nonsemantic_only)
				return false;

			break;
		}

		default:
			return false;
		}
	}

	return true;
}